

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::SupportVectorRegressor::ByteSizeLong(SupportVectorRegressor *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->kernel_ == (Kernel *)0x0 ||
      this == (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Kernel>(this->kernel_);
    sVar1 = sVar1 + 1;
  }
  if (this->coefficients_ != (Coefficients *)0x0 &&
      this != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Coefficients>(this->coefficients_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  sVar2 = sVar1;
  if (this->rho_ != 0.0) {
    sVar2 = sVar1 + 9;
  }
  if (NAN(this->rho_)) {
    sVar2 = sVar1 + 9;
  }
  if (this->_oneof_case_[0] == 3) {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DenseSupportVectors>
                      ((this->supportVectors_).densesupportvectors_);
  }
  else {
    if (this->_oneof_case_[0] != 2) goto LAB_001f5390;
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SparseSupportVectors>
                      ((this->supportVectors_).sparsesupportvectors_);
  }
  sVar2 = sVar2 + sVar1 + 1;
LAB_001f5390:
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t SupportVectorRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SupportVectorRegressor)
  size_t total_size = 0;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->kernel_);
  }

  // .CoreML.Specification.Coefficients coefficients = 4;
  if (this->has_coefficients()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->coefficients_);
  }

  // double rho = 5;
  if (this->rho() != 0) {
    total_size += 1 + 8;
  }

  switch (supportVectors_case()) {
    // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
    case kSparseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.sparsesupportvectors_);
      break;
    }
    // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
    case kDenseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.densesupportvectors_);
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}